

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

int * Gia_ManGigCount(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  int iVar1;
  long lVar2;
  int i;
  
  for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)Gia_ManGigCount::nObjs + lVar2) = 0;
  }
  for (i = 0; i < vObjs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vObjs,i);
    iVar1 = Vec_IntEntry(vStore,iVar1 + 1);
    Gia_ManGigCount::nObjs[iVar1] = Gia_ManGigCount::nObjs[iVar1] + 1;
  }
  return Gia_ManGigCount::nObjs;
}

Assistant:

int * Gia_ManGigCount( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    static int nObjs[GIG_UNUSED]; int i;
    for ( i = 0; i < GIG_UNUSED; i++ )
        nObjs[i] = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        nObjs[Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1)]++;
    return nObjs;
}